

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void convert_32s2u_C1R(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  ulong uVar1;
  int iVar2;
  OPJ_INT32 OVar3;
  byte bVar4;
  
  for (uVar1 = 0; uVar1 < (length & 0xfffffffffffffffc); uVar1 = uVar1 + 4) {
    *pDst = (byte)(pSrc[uVar1 + 2] << 2) | (byte)(pSrc[uVar1 + 1] << 4) | (byte)(pSrc[uVar1] << 6) |
            (byte)pSrc[uVar1 + 3];
    pDst = pDst + 1;
  }
  if ((length & 3) != 0) {
    bVar4 = 0;
    iVar2 = (int)(length & 3);
    if (iVar2 == 1) {
      OVar3 = 0;
    }
    else {
      OVar3 = pSrc[uVar1 + 1];
      if (iVar2 == 3) {
        bVar4 = (byte)(pSrc[uVar1 + 2] << 2);
      }
    }
    *pDst = (byte)(OVar3 << 4) | bVar4 | (byte)(pSrc[uVar1] << 6);
  }
  return;
}

Assistant:

static void convert_32s2u_C1R(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i+=4U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		
		*pDst++ = (OPJ_BYTE)((src0 << 6) | (src1 << 4) | (src2 << 2) | src3);
	}
	
	if (length & 3U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = 0U;
		OPJ_UINT32 src2 = 0U;
		length = length & 3U;
		
		if (length > 1U) {
			src1 = (OPJ_UINT32)pSrc[i+1];
			if (length > 2U) {
				src2 = (OPJ_UINT32)pSrc[i+2];
			}
		}
		*pDst++ = (OPJ_BYTE)((src0 << 6) | (src1 << 4) | (src2 << 2));
	}
}